

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpTest_HostFunc_PingPong_SameThread_Test::TestBody
          (InterpTest_HostFunc_PingPong_SameThread_Test *this)

{
  initializer_list<wabt::interp::Value> __l;
  initializer_list<wabt::interp::Ref> __l_00;
  initializer_list<wabt::Type> __l_01;
  initializer_list<wabt::Type> __l_02;
  initializer_list<unsigned_char> __l_03;
  bool bVar1;
  HostFunc *this_00;
  DefinedFunc *this_01;
  Thread *thread_00;
  char *pcVar2;
  reference this_02;
  AssertHelper local_2d0;
  Message local_2c8;
  u32 local_2c0;
  uint local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_2;
  Message local_2a0;
  size_type local_298;
  uint local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_270;
  Message local_268;
  Enum local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  Value local_240;
  iterator local_228;
  size_type local_220;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_218;
  Ptr local_200;
  Result local_1e4;
  undefined1 local_1e0 [4];
  Result result;
  Ptr trap;
  Values results;
  Ref local_1a8;
  iterator local_1a0;
  size_type local_198;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_190;
  anon_class_8_1_8991fb9c local_178;
  Callback local_170;
  allocator<wabt::Type> local_14d;
  Type local_14c;
  iterator local_148;
  size_type local_140;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_138;
  allocator<wabt::Type> local_11d;
  Type local_11c;
  iterator local_118;
  size_type local_110;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_108;
  FuncType local_f0;
  undefined1 local_b0 [8];
  Ptr host_func;
  undefined1 local_88 [8];
  Ptr thread;
  uchar local_68 [48];
  iterator local_38;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_HostFunc_PingPong_SameThread_Test *local_10;
  InterpTest_HostFunc_PingPong_SameThread_Test *this_local;
  
  local_10 = this;
  memcpy(local_68,&DAT_004e314f,0x30);
  local_38 = local_68;
  local_30 = 0x30;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)((long)&thread.root_index_ + 7));
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l_03,(allocator_type *)((long)&thread.root_index_ + 7));
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&thread.root_index_ + 7));
  memset(&host_func.root_index_,0,0x10);
  wabt::interp::Thread::Options::Options((Options *)&host_func.root_index_);
  wabt::interp::Thread::New
            ((Ptr *)local_88,&(this->super_InterpTest).store_,(Options *)&host_func.root_index_);
  wabt::Type::Type(&local_11c,I32);
  local_118 = &local_11c;
  local_110 = 1;
  std::allocator<wabt::Type>::allocator(&local_11d);
  __l_02._M_len = local_110;
  __l_02._M_array = local_118;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_108,__l_02,&local_11d);
  wabt::Type::Type(&local_14c,I32);
  local_148 = &local_14c;
  local_140 = 1;
  std::allocator<wabt::Type>::allocator(&local_14d);
  __l_01._M_len = local_140;
  __l_01._M_array = local_148;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_138,__l_01,&local_14d);
  wabt::interp::FuncType::FuncType(&local_f0,&local_108,&local_138);
  local_178.this = this;
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_HostFunc_PingPong_SameThread_Test::TestBody()::__0,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_170,&local_178);
  wabt::interp::HostFunc::New((Ptr *)local_b0,&(this->super_InterpTest).store_,&local_f0,&local_170)
  ;
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_170);
  wabt::interp::FuncType::~FuncType(&local_f0);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_138);
  std::allocator<wabt::Type>::~allocator(&local_14d);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_108);
  std::allocator<wabt::Type>::~allocator(&local_11d);
  this_00 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                      ((RefPtr<wabt::interp::HostFunc> *)local_b0);
  local_1a8 = wabt::interp::Object::self((Object *)this_00);
  local_1a0 = &local_1a8;
  local_198 = 1;
  std::allocator<wabt::interp::Ref>::allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __l_00._M_len = local_198;
  __l_00._M_array = local_1a0;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            (&local_190,__l_00,
             (allocator_type *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  InterpTest::Instantiate(&this->super_InterpTest,&local_190);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&local_190);
  std::allocator<wabt::interp::Ref>::~allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_1e0);
  InterpTest::GetFuncExport(&local_200,&this->super_InterpTest,0);
  this_01 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->(&local_200);
  thread_00 = wabt::interp::RefPtr<wabt::interp::Thread>::operator*
                        ((RefPtr<wabt::interp::Thread> *)local_88);
  wabt::interp::Value::Make(&local_240,1);
  local_228 = &local_240;
  local_220 = 1;
  std::allocator<wabt::interp::Value>::allocator
            ((allocator<wabt::interp::Value> *)((long)&gtest_ar.message_.ptr_ + 7));
  __l._M_len = local_220;
  __l._M_array = local_228;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            (&local_218,__l,(allocator_type *)((long)&gtest_ar.message_.ptr_ + 7));
  local_1e4 = wabt::interp::Func::Call
                        (&this_01->super_Func,thread_00,&local_218,(Values *)&trap.root_index_,
                         (Ptr *)local_1e0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_218);
  std::allocator<wabt::interp::Value>::~allocator
            ((allocator<wabt::interp::Value> *)((long)&gtest_ar.message_.ptr_ + 7));
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_200);
  local_25c = Ok;
  testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
            ((EqHelper<false> *)local_258,"Result::Ok","result",&local_25c,&local_1e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x175,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message(&local_268);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_28c = 1;
    local_298 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                          ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                           &trap.root_index_);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_288,"1u","results.size()",&local_28c,&local_298);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar1) {
      testing::Message::Message(&local_2a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                 ,0x176,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_2a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    local_2bc = 0xb;
    this_02 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                        ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                         &trap.root_index_,0);
    local_2c0 = wabt::interp::Value::Get<unsigned_int>(this_02);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_2b8,"11u","results[0].Get<u32>()",&local_2bc,&local_2c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                 ,0x177,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message(&local_2c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_1e0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_b0);
  wabt::interp::RefPtr<wabt::interp::Thread>::~RefPtr((RefPtr<wabt::interp::Thread> *)local_88);
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc_PingPong_SameThread) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (param i32) (result i32)
  //   (call $f (i32.add (local.get 0) (i32.const 1))))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x06, 0x01, 0x60,
      0x01, 0x7f, 0x01, 0x7f, 0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00,
      0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x0b, 0x01, 0x09, 0x00, 0x20, 0x00, 0x41, 0x01, 0x6a, 0x10, 0x00, 0x0b,
  });

  auto thread = Thread::New(store_, {});

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [&](Thread& t, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      auto val = params[0].Get<u32>();
                      if (val < 10) {
                        return GetFuncExport(0)->Call(t, {Value::Make(val * 2)},
                                                      results, out_trap);
                      }
                      results[0] = Value::Make(val);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  // Should produce the following calls:
  //  g(1) -> f(2) -> g(4) -> f(5) -> g(10) -> f(11) -> return 11

  Values results;
  Trap::Ptr trap;
  Result result = GetFuncExport(0)->Call(*thread, {Value::Make(1)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(11u, results[0].Get<u32>());
}